

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_error.cc
# Opt level: O2

char * __thiscall ixxx::sys_error::what(sys_error *this)

{
  int __ecode;
  char *pcVar1;
  ostream *poVar2;
  pointer __p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostringstream o;
  array<char,_256UL> buffer;
  
  pbVar3 = (this->what_)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&o);
    pcVar1 = (char *)(**(code **)(*(long *)this + 0x20))(this);
    poVar2 = std::operator<<((ostream *)&o,pcVar1);
    std::operator<<(poVar2,": ");
    __ecode = this->errno_;
    if (__ecode != 0) {
      if (this->type_ == 1) {
        pcVar1 = gai_strerror(__ecode);
      }
      else if (this->type_ == 0) {
        buffer._M_elems[0] = '\0';
        pcVar1 = strerror_r(__ecode,buffer._M_elems,0x100);
      }
      else {
        pcVar1 = (char *)0x0;
      }
      poVar2 = std::operator<<((ostream *)&o,pcVar1);
      poVar2 = std::operator<<(poVar2," (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->errno_);
      std::operator<<(poVar2,')');
    }
    pcVar1 = this->literal_;
    if (pcVar1 != (char *)0x0) {
      if (this->errno_ != 0) {
        std::operator<<((ostream *)&o," - ");
        pcVar1 = this->literal_;
      }
      std::operator<<((ostream *)&o,pcVar1);
    }
    __p = (pointer)operator_new(0x20);
    std::__cxx11::stringbuf::str();
    std::
    __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->what_,__p);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&o);
    pbVar3 = (this->what_)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
  }
  return (pbVar3->_M_dataplus)._M_p;
}

Assistant:

Function getsockopt_error::function() const { return Function::GETSOCKOPT; }